

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

void __thiscall Fixpp::ParsingContext::setError(ParsingContext *this,Type type,char *errFmt,...)

{
  char in_AL;
  size_type __n;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_238 [24];
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined4 local_208;
  undefined8 local_1f8;
  undefined8 local_1e8;
  undefined8 local_1d8;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  allocator<char> local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  int local_14c;
  undefined4 local_148;
  int count;
  va_list args;
  char acStack_128 [8];
  char errStr [255];
  size_t column;
  char *errFmt_local;
  ParsingContext *pPStack_10;
  Type type_local;
  ParsingContext *this_local;
  
  if (in_AL != '\0') {
    local_208 = in_XMM0_Da;
    local_1f8 = in_XMM1_Qa;
    local_1e8 = in_XMM2_Qa;
    local_1d8 = in_XMM3_Qa;
    local_1c8 = in_XMM4_Qa;
    local_1b8 = in_XMM5_Qa;
    local_1a8 = in_XMM6_Qa;
    local_198 = in_XMM7_Qa;
  }
  local_220 = in_RCX;
  local_218 = in_R8;
  local_210 = in_R9;
  errFmt_local._4_4_ = type;
  pPStack_10 = this;
  register0x00000000 = StreamCursor::operator_cast_to_unsigned_long(this->cursor);
  errStr[0xe8] = '\0';
  errStr[0xe9] = '\0';
  errStr[0xea] = '\0';
  errStr[0xeb] = '\0';
  errStr[0xec] = '\0';
  errStr[0xed] = '\0';
  errStr[0xee] = '\0';
  errStr[0xef] = '\0';
  errStr[0xf0] = '\0';
  errStr[0xf1] = '\0';
  errStr[0xf2] = '\0';
  errStr[0xf3] = '\0';
  errStr[0xf4] = '\0';
  errStr[0xf5] = '\0';
  errStr[0xf6] = '\0';
  errStr[0xd8] = '\0';
  errStr[0xd9] = '\0';
  errStr[0xda] = '\0';
  errStr[0xdb] = '\0';
  errStr[0xdc] = '\0';
  errStr[0xdd] = '\0';
  errStr[0xde] = '\0';
  errStr[0xdf] = '\0';
  errStr[0xe0] = '\0';
  errStr[0xe1] = '\0';
  errStr[0xe2] = '\0';
  errStr[0xe3] = '\0';
  errStr[0xe4] = '\0';
  errStr[0xe5] = '\0';
  errStr[0xe6] = '\0';
  errStr[0xe7] = '\0';
  errStr[200] = '\0';
  errStr[0xc9] = '\0';
  errStr[0xca] = '\0';
  errStr[0xcb] = '\0';
  errStr[0xcc] = '\0';
  errStr[0xcd] = '\0';
  errStr[0xce] = '\0';
  errStr[0xcf] = '\0';
  errStr[0xd0] = '\0';
  errStr[0xd1] = '\0';
  errStr[0xd2] = '\0';
  errStr[0xd3] = '\0';
  errStr[0xd4] = '\0';
  errStr[0xd5] = '\0';
  errStr[0xd6] = '\0';
  errStr[0xd7] = '\0';
  errStr[0xb8] = '\0';
  errStr[0xb9] = '\0';
  errStr[0xba] = '\0';
  errStr[0xbb] = '\0';
  errStr[0xbc] = '\0';
  errStr[0xbd] = '\0';
  errStr[0xbe] = '\0';
  errStr[0xbf] = '\0';
  errStr[0xc0] = '\0';
  errStr[0xc1] = '\0';
  errStr[0xc2] = '\0';
  errStr[0xc3] = '\0';
  errStr[0xc4] = '\0';
  errStr[0xc5] = '\0';
  errStr[0xc6] = '\0';
  errStr[199] = '\0';
  errStr[0xa8] = '\0';
  errStr[0xa9] = '\0';
  errStr[0xaa] = '\0';
  errStr[0xab] = '\0';
  errStr[0xac] = '\0';
  errStr[0xad] = '\0';
  errStr[0xae] = '\0';
  errStr[0xaf] = '\0';
  errStr[0xb0] = '\0';
  errStr[0xb1] = '\0';
  errStr[0xb2] = '\0';
  errStr[0xb3] = '\0';
  errStr[0xb4] = '\0';
  errStr[0xb5] = '\0';
  errStr[0xb6] = '\0';
  errStr[0xb7] = '\0';
  errStr[0x98] = '\0';
  errStr[0x99] = '\0';
  errStr[0x9a] = '\0';
  errStr[0x9b] = '\0';
  errStr[0x9c] = '\0';
  errStr[0x9d] = '\0';
  errStr[0x9e] = '\0';
  errStr[0x9f] = '\0';
  errStr[0xa0] = '\0';
  errStr[0xa1] = '\0';
  errStr[0xa2] = '\0';
  errStr[0xa3] = '\0';
  errStr[0xa4] = '\0';
  errStr[0xa5] = '\0';
  errStr[0xa6] = '\0';
  errStr[0xa7] = '\0';
  errStr[0x88] = '\0';
  errStr[0x89] = '\0';
  errStr[0x8a] = '\0';
  errStr[0x8b] = '\0';
  errStr[0x8c] = '\0';
  errStr[0x8d] = '\0';
  errStr[0x8e] = '\0';
  errStr[0x8f] = '\0';
  errStr[0x90] = '\0';
  errStr[0x91] = '\0';
  errStr[0x92] = '\0';
  errStr[0x93] = '\0';
  errStr[0x94] = '\0';
  errStr[0x95] = '\0';
  errStr[0x96] = '\0';
  errStr[0x97] = '\0';
  errStr[0x78] = '\0';
  errStr[0x79] = '\0';
  errStr[0x7a] = '\0';
  errStr[0x7b] = '\0';
  errStr[0x7c] = '\0';
  errStr[0x7d] = '\0';
  errStr[0x7e] = '\0';
  errStr[0x7f] = '\0';
  errStr[0x80] = '\0';
  errStr[0x81] = '\0';
  errStr[0x82] = '\0';
  errStr[0x83] = '\0';
  errStr[0x84] = '\0';
  errStr[0x85] = '\0';
  errStr[0x86] = '\0';
  errStr[0x87] = '\0';
  errStr[0x68] = '\0';
  errStr[0x69] = '\0';
  errStr[0x6a] = '\0';
  errStr[0x6b] = '\0';
  errStr[0x6c] = '\0';
  errStr[0x6d] = '\0';
  errStr[0x6e] = '\0';
  errStr[0x6f] = '\0';
  errStr[0x70] = '\0';
  errStr[0x71] = '\0';
  errStr[0x72] = '\0';
  errStr[0x73] = '\0';
  errStr[0x74] = '\0';
  errStr[0x75] = '\0';
  errStr[0x76] = '\0';
  errStr[0x77] = '\0';
  errStr[0x58] = '\0';
  errStr[0x59] = '\0';
  errStr[0x5a] = '\0';
  errStr[0x5b] = '\0';
  errStr[0x5c] = '\0';
  errStr[0x5d] = '\0';
  errStr[0x5e] = '\0';
  errStr[0x5f] = '\0';
  errStr[0x60] = '\0';
  errStr[0x61] = '\0';
  errStr[0x62] = '\0';
  errStr[99] = '\0';
  errStr[100] = '\0';
  errStr[0x65] = '\0';
  errStr[0x66] = '\0';
  errStr[0x67] = '\0';
  errStr[0x48] = '\0';
  errStr[0x49] = '\0';
  errStr[0x4a] = '\0';
  errStr[0x4b] = '\0';
  errStr[0x4c] = '\0';
  errStr[0x4d] = '\0';
  errStr[0x4e] = '\0';
  errStr[0x4f] = '\0';
  errStr[0x50] = '\0';
  errStr[0x51] = '\0';
  errStr[0x52] = '\0';
  errStr[0x53] = '\0';
  errStr[0x54] = '\0';
  errStr[0x55] = '\0';
  errStr[0x56] = '\0';
  errStr[0x57] = '\0';
  errStr[0x38] = '\0';
  errStr[0x39] = '\0';
  errStr[0x3a] = '\0';
  errStr[0x3b] = '\0';
  errStr[0x3c] = '\0';
  errStr[0x3d] = '\0';
  errStr[0x3e] = '\0';
  errStr[0x3f] = '\0';
  errStr[0x40] = '\0';
  errStr[0x41] = '\0';
  errStr[0x42] = '\0';
  errStr[0x43] = '\0';
  errStr[0x44] = '\0';
  errStr[0x45] = '\0';
  errStr[0x46] = '\0';
  errStr[0x47] = '\0';
  errStr[0x28] = '\0';
  errStr[0x29] = '\0';
  errStr[0x2a] = '\0';
  errStr[0x2b] = '\0';
  errStr[0x2c] = '\0';
  errStr[0x2d] = '\0';
  errStr[0x2e] = '\0';
  errStr[0x2f] = '\0';
  errStr[0x30] = '\0';
  errStr[0x31] = '\0';
  errStr[0x32] = '\0';
  errStr[0x33] = '\0';
  errStr[0x34] = '\0';
  errStr[0x35] = '\0';
  errStr[0x36] = '\0';
  errStr[0x37] = '\0';
  errStr[0x18] = '\0';
  errStr[0x19] = '\0';
  errStr[0x1a] = '\0';
  errStr[0x1b] = '\0';
  errStr[0x1c] = '\0';
  errStr[0x1d] = '\0';
  errStr[0x1e] = '\0';
  errStr[0x1f] = '\0';
  errStr[0x20] = '\0';
  errStr[0x21] = '\0';
  errStr[0x22] = '\0';
  errStr[0x23] = '\0';
  errStr[0x24] = '\0';
  errStr[0x25] = '\0';
  errStr[0x26] = '\0';
  errStr[0x27] = '\0';
  errStr[8] = '\0';
  errStr[9] = '\0';
  errStr[10] = '\0';
  errStr[0xb] = '\0';
  errStr[0xc] = '\0';
  errStr[0xd] = '\0';
  errStr[0xe] = '\0';
  errStr[0xf] = '\0';
  errStr[0x10] = '\0';
  errStr[0x11] = '\0';
  errStr[0x12] = '\0';
  errStr[0x13] = '\0';
  errStr[0x14] = '\0';
  errStr[0x15] = '\0';
  errStr[0x16] = '\0';
  errStr[0x17] = '\0';
  acStack_128[0] = '\0';
  acStack_128[1] = '\0';
  acStack_128[2] = '\0';
  acStack_128[3] = '\0';
  acStack_128[4] = '\0';
  acStack_128[5] = '\0';
  acStack_128[6] = '\0';
  acStack_128[7] = '\0';
  errStr[0] = '\0';
  errStr[1] = '\0';
  errStr[2] = '\0';
  errStr[3] = '\0';
  errStr[4] = '\0';
  errStr[5] = '\0';
  errStr[6] = '\0';
  errStr[7] = '\0';
  args[0].overflow_arg_area = local_238;
  args[0]._0_8_ = &stack0x00000008;
  count = 0x30;
  local_148 = 0x18;
  local_14c = vsnprintf(acStack_128,0xff,errFmt,&local_148);
  __n = (size_type)local_14c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,acStack_128,__n,&local_171);
  Deferred<Fixpp::ErrorKind>::construct<Fixpp::ErrorKind::Type&,unsigned_long&,std::__cxx11::string>
            (&this->error,(Type *)((long)&errFmt_local + 4),(unsigned_long *)(errStr + 0xf8),
             &local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  return;
}

Assistant:

void setError(ErrorKind::Type type, const char* errFmt, ...)
        {
            auto column = static_cast<size_t>(cursor);

            char errStr[255];
            std::memset(errStr, 0, sizeof errStr);
            va_list args;
            va_start(args, errFmt);
            auto count = std::vsnprintf(errStr, sizeof errStr, errFmt, args);
            va_end(args);

            error.construct(type, column, std::string(errStr, count));
        }